

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
vkt::shaderexecutor::VariableStatement<tcu::Matrix<float,_3,_2>_>::VariableStatement
          (VariableStatement<tcu::Matrix<float,_3,_2>_> *this,
          VariableP<tcu::Matrix<float,_3,_2>_> *variable,ExprP<tcu::Matrix<float,_3,_2>_> *value,
          bool isDeclaration)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__VariableStatement_00d3bc70;
  (this->m_variable).
  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.m_ptr =
       (variable->super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>).
       m_ptr;
  pSVar2 = (variable->
           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>).m_state
  ;
  (this->m_variable).
  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_variable).
               super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.
              m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  (this->m_value).super_ContainerExprPBase<tcu::Matrix<float,_3,_2>_>.
  super_ExprPBase<tcu::Matrix<float,_3,_2>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_2>_>_>.m_ptr =
       (value->super_ContainerExprPBase<tcu::Matrix<float,_3,_2>_>).
       super_ExprPBase<tcu::Matrix<float,_3,_2>_>.
       super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_2>_>_>.m_ptr;
  pSVar2 = (value->super_ContainerExprPBase<tcu::Matrix<float,_3,_2>_>).
           super_ExprPBase<tcu::Matrix<float,_3,_2>_>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_2>_>_>.m_state;
  (this->m_value).super_ContainerExprPBase<tcu::Matrix<float,_3,_2>_>.
  super_ExprPBase<tcu::Matrix<float,_3,_2>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_2>_>_>.m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_value).super_ContainerExprPBase<tcu::Matrix<float,_3,_2>_>.
               super_ExprPBase<tcu::Matrix<float,_3,_2>_>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_2>_>_>.m_state)
              ->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  this->m_isDeclaration = isDeclaration;
  return;
}

Assistant:

VariableStatement	(const VariableP<T>& variable, const ExprP<T>& value,
										 bool isDeclaration)
						: m_variable		(variable)
						, m_value			(value)
						, m_isDeclaration	(isDeclaration) {}